

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeHistogram.cpp
# Opt level: O2

void __thiscall OpenMD::ChargeHistogram::process(ChargeHistogram *this)

{
  vector<double,_std::allocator<double>_> *this_00;
  AtomType *pAVar1;
  pointer pdVar2;
  pointer pdVar3;
  ChargeHistogram *pCVar4;
  bool bVar5;
  int iVar6;
  StuntDouble *pSVar7;
  pointer pdVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int istep;
  ChargeHistogram *pCVar12;
  RealType RVar13;
  undefined1 auVar14 [16];
  double dVar15;
  RealType min;
  FixedChargeAdapter fca;
  vector<double,_std::allocator<double>_> charge;
  FluctuatingChargeAdapter fqa;
  int ii;
  DumpReader reader;
  value_type_conflict2 local_12e0;
  ChargeHistogram *local_12d8;
  FixedChargeAdapter local_12d0;
  _Vector_base<double,_std::allocator<double>_> local_12c8;
  double local_12a8;
  double local_12a0;
  FluctuatingChargeAdapter local_1298;
  int local_128c;
  DumpReader local_1288;
  
  local_12d8 = this;
  if ((this->evaluator_).isDynamic_ == true) {
    SelectionEvaluator::evaluate((SelectionSet *)&local_1288,&this->evaluator_);
    SelectionManager::setSelectionSet(&this->seleMan_,(SelectionSet *)&local_1288);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_1288);
  }
  pCVar4 = local_12d8;
  DumpReader::DumpReader
            (&local_1288,(local_12d8->super_StaticAnalyser).info_,
             &(local_12d8->super_StaticAnalyser).dumpFilename_);
  iVar6 = DumpReader::getNFrames(&local_1288);
  local_12a8 = (double)CONCAT44(local_12a8._4_4_,iVar6);
  local_12c8._M_impl.super__Vector_impl_data._M_start = (double *)0x0;
  local_12c8._M_impl.super__Vector_impl_data._M_finish = (double *)0x0;
  local_12c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar4->nProcessed_ = iVar6 / (pCVar4->super_StaticAnalyser).step_;
  pCVar12 = pCVar4;
  for (iVar6 = 0; iVar6 < local_12a8._0_4_; iVar6 = iVar6 + (local_12d8->super_StaticAnalyser).step_
      ) {
    DumpReader::readFrame(&local_1288,iVar6);
    local_12d8->currentSnapshot_ =
         ((local_12d8->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
    pSVar7 = SelectionManager::beginSelected(&pCVar4->seleMan_,&local_128c);
    while (pSVar7 != (StuntDouble *)0x0) {
      local_12e0 = 0.0;
      pAVar1 = (AtomType *)pSVar7[1]._vptr_StuntDouble;
      local_12d0.at_ = pAVar1;
      bVar5 = FixedChargeAdapter::isFixedCharge(&local_12d0);
      if (bVar5) {
        RVar13 = FixedChargeAdapter::getCharge(&local_12d0);
        local_12e0 = RVar13 + local_12e0;
      }
      local_1298.at_ = pAVar1;
      bVar5 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_1298);
      if (bVar5) {
        local_12e0 = *(double *)
                      (*(long *)((long)&(pSVar7->snapshotMan_->currentSnapshot_->atomData).flucQPos.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start + pSVar7->storage_) +
                      (long)pSVar7->localIndex_ * 8) + local_12e0;
      }
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)&local_12c8,&local_12e0);
      pSVar7 = SelectionManager::nextSelected(&pCVar4->seleMan_,&local_128c);
    }
    pCVar12 = local_12d8;
  }
  if (local_12c8._M_impl.super__Vector_impl_data._M_start ==
      local_12c8._M_impl.super__Vector_impl_data._M_finish) {
    builtin_strncpy(painCave.errMsg + 0x10,"t found.\n",10);
    builtin_strncpy(painCave.errMsg,"Selected atom no",0x10);
    painCave.isFatal = 1;
    simError();
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_12c8._M_impl.super__Vector_impl_data._M_start,
             local_12c8._M_impl.super__Vector_impl_data._M_finish);
  local_12e0 = *local_12c8._M_impl.super__Vector_impl_data._M_start;
  iVar6 = pCVar12->nBins_;
  dVar15 = (local_12c8._M_impl.super__Vector_impl_data._M_finish[-1] - local_12e0) / (double)iVar6;
  this_00 = &pCVar12->bincenter_;
  if ((dVar15 != 0.0) || (NAN(dVar15))) {
    local_12a8 = local_12e0;
    local_12a0 = dVar15;
    for (iVar11 = 0; iVar11 < iVar6 + 3; iVar11 = iVar11 + 1) {
      local_12d0.at_ = (AtomType *)((double)(iVar11 + -1) * local_12a0 + local_12a8);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (this_00,(double *)&local_12d0);
      local_12d0.at_ = (AtomType *)0x0;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (&pCVar12->histList_,(double *)&local_12d0);
      iVar6 = local_12d8->nBins_;
    }
    lVar9 = (long)local_12c8._M_impl.super__Vector_impl_data._M_finish -
            (long)local_12c8._M_impl.super__Vector_impl_data._M_start >> 3;
    auVar14._8_4_ =
         (int)((long)local_12c8._M_impl.super__Vector_impl_data._M_finish -
               (long)local_12c8._M_impl.super__Vector_impl_data._M_start >> 0x23);
    auVar14._0_8_ = lVar9;
    auVar14._12_4_ = 0x45300000;
    lVar10 = 0;
    for (pdVar8 = local_12c8._M_impl.super__Vector_impl_data._M_start;
        pdVar8 < local_12c8._M_impl.super__Vector_impl_data._M_finish; pdVar8 = pdVar8 + 1) {
      pdVar2 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (pCVar12->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar10 = (long)(int)lVar10; (*pdVar8 < pdVar2[lVar10] || (pdVar2[lVar10 + 1] <= *pdVar8))
          ; lVar10 = lVar10 + 1) {
      }
      pdVar3[lVar10] =
           pdVar3[lVar10] +
           1.0 / ((auVar14._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0));
    }
  }
  else {
    std::vector<double,_std::allocator<double>_>::push_back(this_00,&local_12e0);
    local_12d0.at_ = (AtomType *)0x3ff0000000000000;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&pCVar12->histList_,(double *)&local_12d0);
  }
  (*(local_12d8->super_StaticAnalyser)._vptr_StaticAnalyser[4])();
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_12c8);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void ChargeHistogram::process() {
    StuntDouble* sd;
    int ii;

    if (evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;
    vector<RealType> charge;

    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        RealType q = 0.0;
        Atom* atom = static_cast<Atom*>(sd);

        AtomType* atomType = atom->getAtomType();

        FixedChargeAdapter fca = FixedChargeAdapter(atomType);
        if (fca.isFixedCharge()) { q += fca.getCharge(); }

        FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
        if (fqa.isFluctuatingCharge()) { q += atom->getFlucQPos(); }

        charge.push_back(q);
      }
    }

    if (charge.empty()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Selected atom not found.\n");
      painCave.isFatal = 1;
      simError();
    }

    std::sort(charge.begin(), charge.end());

    RealType min = charge.front();
    RealType max = charge.back();

    RealType delta_charge = (max - min) / (nBins_);

    if (delta_charge == 0) {
      bincenter_.push_back(min);
      histList_.push_back(1);
    } else {
      // fill the center for histogram
      for (int j = 0; j < nBins_ + 3; ++j) {
        bincenter_.push_back(min + (j - 1) * delta_charge);
        histList_.push_back(0);
      }
      // filling up the histogram whith the densities
      int bin_center_pos = 0;
      vector<RealType>::iterator index;
      RealType charge_length = static_cast<RealType>(charge.size());

      bool hist_update;
      for (index = charge.begin(); index < charge.end(); index++) {
        hist_update = true;
        while (hist_update) {
          if (*index >= bincenter_[bin_center_pos] &&
              *index < bincenter_[bin_center_pos + 1]) {
            histList_[bin_center_pos] += 1.0 / charge_length;
            hist_update = false;
          } else {
            bin_center_pos++;
            hist_update = true;
          }
        }
      }
    }
    writeCharge();
  }